

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O3

void __thiscall
embree::SubdivPatch1Base::SubdivPatch1Base
          (SubdivPatch1Base *this,uint gID,uint pID,uint subPatch,SubdivMesh *mesh,size_t time,
          Vec2f *uv,float *edge_level,int *subdiv,int simd_width)

{
  HalfEdge *pHVar1;
  char *pcVar2;
  undefined4 *puVar3;
  undefined1 *puVar4;
  long *plVar5;
  PatchType PVar6;
  Topology *pTVar7;
  HalfEdge *pHVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  char *pcVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  size_t i;
  ulong uVar16;
  long lVar17;
  undefined1 *puVar18;
  void *pvVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  uint uVar26;
  uint uVar27;
  HalfEdge *pHVar28;
  HalfEdge *pHVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  float fVar37;
  float fVar38;
  uint local_df8;
  uint local_df4;
  EVP_PKEY_CTX local_d80 [4];
  uint local_d7c [2];
  float local_d74 [13];
  undefined1 local_d40 [64];
  long local_d00 [8];
  float local_cc0 [2];
  uint local_cb8 [2];
  undefined8 local_cb0 [6];
  undefined1 local_c80 [512];
  long local_a80 [224];
  undefined1 local_380 [848];
  
  (this->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i = 0;
  (this->mtx).flag.super_atomic<bool>._M_base._M_i = false;
  this->flags = '\0';
  this->type = '\0';
  this->geom = gID;
  this->prim = pID;
  this->time_ = (uint)time;
  pTVar7 = (mesh->topology).items;
  pHVar8 = (pTVar7->halfEdges).items;
  uVar22 = (pTVar7->mesh->faceStartEdge).items[pID];
  pHVar1 = pHVar8 + uVar22;
  PVar6 = pHVar8[uVar22].patch_type;
  if (PVar6 == REGULAR_QUAD_PATCH) {
    this->type = '\x01';
    pBVar9 = (mesh->vertices).items;
    puVar24 = local_c80;
    puVar25 = local_d40;
    lVar20 = 0;
    do {
      *(undefined1 **)((long)local_d00 + lVar20) = puVar25 + lVar20;
      *(undefined8 *)((long)local_cb8 + lVar20) = 0;
      *(undefined1 **)((long)local_a80 + lVar20) = puVar24 + lVar20;
      lVar20 = lVar20 + 0x340;
    } while (lVar20 != 0xd00);
    pcVar10 = pBVar9[time].super_RawBufferView.ptr_ofs;
    uVar16 = (ulong)(uint)pBVar9[time].super_RawBufferView.stride;
    lVar20 = 0;
    do {
      lVar21 = lVar20 * 0x340;
      pHVar8 = pHVar1 + lVar20;
      *(undefined4 *)(local_d80 + lVar21) = 0xffffffff;
      uVar12 = *(undefined8 *)(pcVar10 + pHVar1[lVar20].vtx_index * uVar16 + 8);
      local_cb0[lVar20 * 0x68] = *(undefined8 *)(pcVar10 + pHVar1[lVar20].vtx_index * uVar16);
      local_cb0[lVar20 * 0x68 + 1] = uVar12;
      local_d74[lVar20 * 0xd0] = pHVar1[lVar20].vertex_crease_weight;
      local_cc0[lVar20 * 0xd0 + 1] = pHVar1[lVar20].edge_level;
      local_cc0[lVar20 * 0xd0] = 0.0;
      puVar4 = local_c80 + lVar21;
      plVar5 = local_a80 + lVar20 * 0x68;
      local_df4 = 0xffffffff;
      local_df8 = 0xffffffff;
      uVar23 = 0;
      pHVar28 = pHVar8;
      do {
        fVar37 = pHVar28->edge_level;
        if (pHVar28->edge_level <= local_cc0[lVar20 * 0xd0]) {
          fVar37 = local_cc0[lVar20 * 0xd0];
        }
        local_cc0[lVar20 * 0xd0] = fVar37;
        fVar37 = pHVar28->edge_crease_weight;
        puVar18 = (undefined1 *)local_d00[lVar20 * 0x68];
        uVar22 = (uint)uVar23;
        if ((0x1f < uVar22) && (puVar18 == local_d40 + lVar21)) {
          pvVar19 = operator_new__(0x100);
          local_d00[lVar20 * 0x68] = (long)pvVar19;
          lVar31 = 0;
          do {
            *(undefined4 *)(local_d00[lVar20 * 0x68] + lVar31 * 4) =
                 *(undefined4 *)(puVar25 + lVar31 * 4);
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x10);
          puVar18 = (undefined1 *)local_d00[lVar20 * 0x68];
        }
        *(float *)(puVar18 + (uVar23 >> 1) * 4) = fVar37;
        lVar31 = (long)pHVar28->next_half_edge_ofs;
        uVar26 = pHVar28[lVar31].vtx_index;
        uVar12 = *(undefined8 *)(pcVar10 + uVar16 * uVar26);
        uVar13 = *(undefined8 *)(pcVar10 + uVar16 * uVar26 + 8);
        uVar27 = uVar22 + 1;
        puVar18 = (undefined1 *)*plVar5;
        if ((0x20 < uVar27) && (puVar18 == puVar4)) {
          pvVar19 = alignedMalloc(0x800,0x10);
          *plVar5 = (long)pvVar19;
          lVar32 = 0;
          do {
            lVar17 = *plVar5;
            uVar14 = *(undefined8 *)((long)(puVar24 + lVar32) + 8);
            *(undefined8 *)(lVar17 + lVar32) = *(undefined8 *)(puVar24 + lVar32);
            ((undefined8 *)(lVar17 + lVar32))[1] = uVar14;
            lVar32 = lVar32 + 0x10;
          } while (lVar32 != 0x200);
          puVar18 = (undefined1 *)*plVar5;
        }
        *(undefined8 *)(puVar18 + uVar23 * 0x10) = uVar12;
        *(undefined8 *)((long)(puVar18 + uVar23 * 0x10) + 8) = uVar13;
        if (uVar26 < local_df8) {
          local_df8 = uVar26;
          local_df4 = uVar27 >> 1;
        }
        lVar32 = (long)pHVar28[lVar31].next_half_edge_ofs;
        uVar12 = *(undefined8 *)(pcVar10 + pHVar28[lVar31 + lVar32].vtx_index * uVar16);
        uVar13 = *(undefined8 *)(pcVar10 + pHVar28[lVar31 + lVar32].vtx_index * uVar16 + 8);
        uVar26 = uVar22 + 2;
        puVar18 = (undefined1 *)*plVar5;
        if ((0x20 < uVar26) && (puVar18 == puVar4)) {
          pvVar19 = alignedMalloc(0x800,0x10);
          *plVar5 = (long)pvVar19;
          lVar17 = 0;
          do {
            lVar11 = *plVar5;
            uVar14 = *(undefined8 *)((long)(puVar24 + lVar17) + 8);
            *(undefined8 *)(lVar11 + lVar17) = *(undefined8 *)(puVar24 + lVar17);
            ((undefined8 *)(lVar11 + lVar17))[1] = uVar14;
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x200);
          puVar18 = (undefined1 *)*plVar5;
        }
        *(undefined8 *)(puVar18 + (ulong)uVar27 * 0x10) = uVar12;
        *(undefined8 *)((long)(puVar18 + (ulong)uVar27 * 0x10) + 8) = uVar13;
        if ((long)pHVar28[lVar31 + lVar32 + pHVar28[lVar31 + lVar32].next_half_edge_ofs].
                  opposite_half_edge_ofs == 0) {
          uVar27 = pHVar28[lVar31 + lVar32 + pHVar28[lVar31 + lVar32].next_half_edge_ofs].vtx_index;
          uVar30 = uVar26 >> 1;
          if (uVar27 < local_df8) {
            local_df8 = uVar27;
            local_df4 = uVar30;
          }
          *(uint *)(local_d80 + lVar21) = uVar26;
          puVar18 = (undefined1 *)local_d00[lVar20 * 0x68];
          if (uVar26 < 0x20) {
            *(undefined4 *)(puVar18 + (ulong)uVar30 * 4) = 0x7f800000;
            pcVar2 = pcVar10 + uVar27 * uVar16;
            uVar33 = *(undefined4 *)pcVar2;
            uVar34 = *(undefined4 *)(pcVar2 + 4);
            uVar35 = *(undefined4 *)(pcVar2 + 8);
            uVar36 = *(undefined4 *)(pcVar2 + 0xc);
LAB_00d56c8c:
            puVar18 = (undefined1 *)*plVar5;
          }
          else {
            if (puVar18 == local_d40 + lVar21) {
              pvVar19 = operator_new__(0x100);
              local_d00[lVar20 * 0x68] = (long)pvVar19;
              lVar31 = 0;
              do {
                *(undefined4 *)(local_d00[lVar20 * 0x68] + lVar31 * 4) =
                     *(undefined4 *)(puVar25 + lVar31 * 4);
                lVar31 = lVar31 + 1;
              } while (lVar31 != 0x10);
              puVar18 = (undefined1 *)local_d00[lVar20 * 0x68];
            }
            *(undefined4 *)(puVar18 + (ulong)uVar30 * 4) = 0x7f800000;
            pcVar2 = pcVar10 + uVar27 * uVar16;
            uVar33 = *(undefined4 *)pcVar2;
            uVar34 = *(undefined4 *)(pcVar2 + 4);
            uVar35 = *(undefined4 *)(pcVar2 + 8);
            uVar36 = *(undefined4 *)(pcVar2 + 0xc);
            puVar18 = (undefined1 *)*plVar5;
            if ((0x20 < uVar22 + 3) && (puVar18 == puVar4)) {
              alignedMalloc(0x800,0x10);
              embree::SubdivPatch1Base();
              goto LAB_00d56c8c;
            }
          }
          puVar3 = (undefined4 *)(puVar18 + (ulong)uVar26 * 0x10);
          *puVar3 = uVar33;
          puVar3[1] = uVar34;
          puVar3[2] = uVar35;
          puVar3[3] = uVar36;
          uVar26 = uVar22 + 4;
          puVar18 = (undefined1 *)*plVar5;
          if ((0x20 < uVar26) && (puVar18 == puVar4)) {
            pvVar19 = alignedMalloc(0x800,0x10);
            *plVar5 = (long)pvVar19;
            lVar31 = 0;
            do {
              lVar32 = *plVar5;
              uVar12 = *(undefined8 *)((long)(puVar24 + lVar31) + 8);
              *(undefined8 *)(lVar32 + lVar31) = *(undefined8 *)(puVar24 + lVar31);
              ((undefined8 *)(lVar32 + lVar31))[1] = uVar12;
              lVar31 = lVar31 + 0x10;
            } while (lVar31 != 0x200);
            puVar18 = (undefined1 *)*plVar5;
          }
          uVar12 = local_cb0[lVar20 * 0x68 + 1];
          *(undefined8 *)(puVar18 + (ulong)(uVar22 + 3) * 0x10) = local_cb0[lVar20 * 0x68];
          *(undefined8 *)((long)(puVar18 + (ulong)(uVar22 + 3) * 0x10) + 8) = uVar12;
          iVar15 = pHVar8->opposite_half_edge_ofs;
          pHVar29 = pHVar8;
          if (iVar15 == 0) break;
          do {
            lVar31 = (long)iVar15;
            pHVar28 = pHVar29 + lVar31 + pHVar29[lVar31].next_half_edge_ofs;
            iVar15 = pHVar29[lVar31 + pHVar29[lVar31].next_half_edge_ofs].opposite_half_edge_ofs;
            pHVar29 = pHVar28;
          } while (iVar15 != 0);
        }
        else {
          pHVar28 = pHVar28 + lVar31 + lVar32 + pHVar28[lVar31 + lVar32].next_half_edge_ofs +
                    pHVar28[lVar31 + lVar32 + pHVar28[lVar31 + lVar32].next_half_edge_ofs].
                    opposite_half_edge_ofs;
        }
        uVar23 = (ulong)uVar26;
      } while (pHVar28 != pHVar8);
      local_d7c[lVar20 * 0xd0 + 1] = uVar26;
      local_d7c[lVar20 * 0xd0] = uVar26 >> 1;
      local_cb8[lVar20 * 0xd0 + 1] = local_df8;
      local_cb8[lVar20 * 0xd0] = local_df4;
      lVar20 = lVar20 + 1;
      puVar25 = puVar25 + 0x340;
      puVar24 = puVar24 + 0x340;
    } while (lVar20 != 4);
    BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
              ((BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)this->patch_v,local_d80);
    lVar20 = -0xd00;
    puVar24 = local_380;
    do {
      puVar25 = *(undefined1 **)(puVar24 + 0x2c0);
      if (puVar25 != (undefined1 *)0x0 && puVar24 + 0xc0 != puVar25) {
        alignedFree(puVar25);
      }
      puVar25 = *(undefined1 **)(puVar24 + 0x40);
      if (puVar25 != (undefined1 *)0x0 && puVar24 != puVar25) {
        operator_delete__(puVar25);
      }
      puVar24 = puVar24 + -0x340;
      lVar20 = lVar20 + 0x340;
    } while (lVar20 != 0);
  }
  else if (PVar6 == BILINEAR_PATCH) {
    this->type = '\x06';
    pBVar9 = (mesh->vertices).items;
    pcVar10 = pBVar9[time].super_RawBufferView.ptr_ofs;
    uVar16 = (ulong)(uint)pBVar9[time].super_RawBufferView.stride;
    uVar12 = *(undefined8 *)(pcVar10 + pHVar1->vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][0].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1->vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][0].field_0 + 8) = uVar12;
    lVar20 = (long)pHVar1->next_half_edge_ofs;
    uVar12 = *(undefined8 *)(pcVar10 + pHVar1[lVar20].vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][1].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1[lVar20].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][1].field_0 + 8) = uVar12;
    lVar21 = (long)pHVar1[lVar20].next_half_edge_ofs;
    uVar12 = *(undefined8 *)(pcVar10 + pHVar1[lVar20 + lVar21].vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][2].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1[lVar20 + lVar21].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][2].field_0 + 8) = uVar12;
    uVar12 = *(undefined8 *)
              (pcVar10 + pHVar1[lVar20 + lVar21 + pHVar1[lVar20 + lVar21].next_half_edge_ofs].
                         vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][3].field_0 =
         *(undefined8 *)
          (pcVar10 +
          pHVar1[lVar20 + lVar21 + pHVar1[lVar20 + lVar21].next_half_edge_ofs].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][3].field_0 + 8) = uVar12;
  }
  else {
    this->type = '\x05';
    pTVar7 = (mesh->topology).items;
    *(HalfEdge **)&this->patch_v[0][0].field_0 =
         (pTVar7->halfEdges).items + (pTVar7->mesh->faceStartEdge).items[pID];
    this->patch_v[0][0].field_0.m128[2] = (float)subPatch;
  }
  lVar20 = 0;
  do {
    fVar37 = uv[lVar20].field_0.field_0.x * 8192.0;
    if (65535.0 <= fVar37) {
      fVar37 = 65535.0;
    }
    fVar38 = 0.0;
    if (0.0 <= fVar37) {
      fVar38 = fVar37;
    }
    this->u[lVar20] = (unsigned_short)(int)fVar38;
    fVar37 = uv[lVar20].field_0.field_0.y * 8192.0;
    if (65535.0 <= fVar37) {
      fVar37 = 65535.0;
    }
    fVar38 = 0.0;
    if (0.0 <= fVar37) {
      fVar38 = fVar37;
    }
    this->v[lVar20] = (unsigned_short)(int)fVar38;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  updateEdgeLevels(this,edge_level,subdiv,(SubdivMesh *)0x4,simd_width);
  return;
}

Assistant:

SubdivPatch1Base::SubdivPatch1Base (const unsigned int gID,
                                      const unsigned int pID,
                                      const unsigned int subPatch,
                                      const SubdivMesh *const mesh,
                                      const size_t time,
                                      const Vec2f uv[4],
                                      const float edge_level[4],
                                      const int subdiv[4],
                                      const int simd_width)
  : flags(0), type(INVALID_PATCH), geom(gID), prim(pID), time_(unsigned(time))
  {
    static_assert(sizeof(SubdivPatch1Base) == 5 * 64, "SubdivPatch1Base has wrong size");

    const HalfEdge* edge = mesh->getHalfEdge(0,pID);

    if (edge->patch_type == HalfEdge::BILINEAR_PATCH)
    {
      type = BILINEAR_PATCH;
      new (patch_v) BilinearPatch3fa(edge,mesh->getVertexBuffer(time));
    }
    else if (edge->patch_type == HalfEdge::REGULAR_QUAD_PATCH) 
    {
#if PATCH_USE_BEZIER_PATCH 
      type = BEZIER_PATCH;
      new (patch_v) BezierPatch3fa(BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
#else
      type = BSPLINE_PATCH;
      new (patch_v) BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))); // FIXME: init BSpline directly from half edge structure
#endif      
    }
#if PATCH_USE_GREGORY == 2
    else if (edge->patch_type == HalfEdge::IRREGULAR_QUAD_PATCH) 
    {
      type = GREGORY_PATCH;
      new (patch_v) DenseGregoryPatch3fa(GregoryPatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
    }
#endif
    else
    {
      type = EVAL_PATCH;
      set_edge(mesh->getHalfEdge(0,pID));
      set_subPatch(subPatch);
    }